

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  if ((iLit0 < 0) || (iLit1 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  iVar5 = ((uint)iLit0 >> 1) * 0x1f01;
  iVar7 = ((uint)iLit1 >> 1) * 0xb9b;
  iVar6 = iVar5 + 0x38f;
  if ((iLit0 & 1U) == 0) {
    iVar6 = iVar5;
  }
  uVar1 = (p->vHTable).nSize;
  iVar5 = iVar7 + 0x161;
  if ((iLit1 & 1U) == 0) {
    iVar5 = iVar7;
  }
  uVar3 = (ulong)(uint)(iVar5 + iVar6 + iLitC * 0x7db) % (ulong)uVar1;
  iVar6 = (int)uVar3;
  if ((-1 < iVar6) && (iVar6 < (int)uVar1)) {
    iVar6 = (p->vHash).nSize;
    if (iVar6 != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vHash) == Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                    ,0x39,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    puVar2 = p->pMuxes;
    if (iLit1 <= iLit0 && puVar2 == (uint *)0x0) {
      __assert_fail("p->pMuxes || iLit0 < iLit1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                    ,0x3a,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    puVar4 = (uint *)((p->vHTable).pArray + uVar3);
    if ((iLit1 <= iLit0) && (((iLit1 | iLit0) & 1U) != 0)) {
      __assert_fail("iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                    ,0x3b,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    if ((iLitC != -1 & (byte)iLit1) != 0) {
      __assert_fail("iLitC == -1 || !Abc_LitIsCompl(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                    ,0x3c,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
    }
    do {
      uVar1 = *puVar4;
      if (uVar1 == 0) {
        return (int *)puVar4;
      }
      if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = *(ulong *)(p->pObjs + uVar1);
      iVar5 = uVar1 - ((uint)uVar3 & 0x1fffffff);
      if (iVar5 < 0) {
LAB_00208434:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (((uint)(uVar3 >> 0x1d) & 1) + iVar5 * 2 == iLit0) {
        uVar8 = (uint)(uVar3 >> 0x20);
        iVar5 = uVar1 - (uVar8 & 0x1fffffff);
        if (iVar5 < 0) goto LAB_00208434;
        if ((uVar8 >> 0x1d & 1) + iVar5 * 2 == iLit1) {
          if (puVar2 == (uint *)0x0) {
            return (int *)puVar4;
          }
          if ((-(uint)(puVar2[uVar1] == 0) | puVar2[uVar1]) == iLitC) {
            return (int *)puVar4;
          }
        }
      }
      if (iVar6 <= (int)uVar1) break;
      puVar4 = (uint *)((p->vHash).pArray + uVar1);
    } while( true );
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    int iThis, * pPlace = Vec_IntEntryP( &p->vHTable, Gia_ManHashOne( iLit0, iLit1, iLitC, Vec_IntSize(&p->vHTable) ) );
    assert( Vec_IntSize(&p->vHash) == Gia_ManObjNum(p) );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( ; (iThis = *pPlace); pPlace = Vec_IntEntryP(&p->vHash, iThis) )
    {
        Gia_Obj_t * pThis = Gia_ManObj( p, iThis );
        if ( Gia_ObjFaninLit0(pThis, iThis) == iLit0 && Gia_ObjFaninLit1(pThis, iThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
            break;
    }
    return pPlace;
}